

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

void __thiscall Sequence::newSeq(Sequence *this)

{
  int iVar1;
  element_type *peVar2;
  __shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type __n;
  uint it;
  long lVar4;
  long lVar5;
  EqGrNode_S x;
  FreqIt_SS fit;
  __shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_50;
  __shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  
  peVar2 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->use_hash != 0) {
    std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>::reserve
              ((this->FreqArray).
               super___shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,this->FreqArraySz);
    peVar2 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  iVar1 = peVar2->use_ascending;
  if ((long)iVar1 == -2) {
    it = peVar2->dbase_max_item;
    while (0 < (int)it) {
      it = it - 1;
      std::__shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,
                 &(((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->eqgraph).
                  super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[it].
                  super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>);
      if (local_60._M_ptr != (element_type *)0x0) {
        if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            use_hash != 0) {
          this->FreqArrayPos = 0;
        }
        process_class(this,it);
        if ((((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             use_hash != 0) && (0 < this->FreqArrayPos)) {
          std::
          make_shared<std::vector<std::shared_ptr<FreqIt>,std::allocator<std::shared_ptr<FreqIt>>>,int&>
                    ((int *)&local_50);
          for (__n = 0; (long)__n < (long)this->FreqArrayPos; __n = __n + 1) {
            p_Var3 = &std::
                      vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>::at
                                ((this->FreqArray).
                                 super___shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,__n)->
                      super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>;
            this_00 = &std::
                       vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>::
                       at(local_50._M_ptr,__n)->
                       super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,p_Var3);
          }
          lVar4 = *(long *)&(((this->invdb).
                              super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->eqgraph).
                            super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[it].
                            super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>;
          std::
          __shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_40,&local_50);
          iVar1 = this->FreqArrayPos;
          std::
          __shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=((__shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)(lVar4 + 0x40),&local_40);
          *(int *)(lVar4 + 0x50) = iVar1;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    }
  }
  else if (iVar1 == -1) {
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < peVar2->dbase_max_item; lVar4 = lVar4 + 1) {
      if (*(long *)((long)&((((this->invdb).
                              super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->eqgraph).
                            super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> + lVar5) != 0) {
        process_class(this,(int)lVar4);
        peVar2 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      lVar5 = lVar5 + 0x10;
    }
  }
  else if (*(long *)&(((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->eqgraph).
                     super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar1].
                     super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> != 0) {
    process_class(this,iVar1);
    return;
  }
  return;
}

Assistant:

void Sequence::newSeq() {
    int i, j;

    if (args->use_hash) {
        FreqArray->reserve(FreqArraySz);
    }
    //form large itemsets for each eqclass
    if (args->use_ascending != -2) {
        if (args->use_ascending == -1) {
            for (i = 0; i < args->dbase_max_item; i++)
                if (invdb->get_eqgraph_item(i)) {
                    process_class(i);
                }
        } else if (invdb->get_eqgraph_item(args->use_ascending))
            process_class(args->use_ascending);
    } else {
        for (i = args->dbase_max_item - 1; i >= 0; i--) {
            auto x = invdb->get_eqgraph_item(i);
            if (x != nullptr) {
                if (args->use_hash) FreqArrayPos = 0;
                process_class(i);
                if (args->use_hash) {
                    if (FreqArrayPos > 0) {
                        FreqIt_SS fit = make_shared<vector<FreqIt_S>>(FreqArrayPos);
                        for (j = 0; j < FreqArrayPos; j++) {
                            fit->at(j) = FreqArray->at(j);
                        }
                        invdb->get_eqgraph_item(i)->set_freqarray(fit, FreqArrayPos);
                    }
                }
            }
        }
    }
}